

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O2

optional<markdown::LinkIds::Target> * __thiscall
markdown::LinkIds::find
          (optional<markdown::LinkIds::Target> *__return_storage_ptr__,LinkIds *this,string *id)

{
  node_pointer ppVar1;
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)id);
  _scrubKey(&sStack_58,&local_38);
  ppVar1 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find_node((table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  if (ppVar1 == (node_pointer)0x0) {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  else {
    boost::optional_detail::optional_base<markdown::LinkIds::Target>::optional_base
              (&__return_storage_ptr__->super_type,
               (undefined1 *)((long)&(ppVar1->value_base_).data_.data_ + 0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

optional<LinkIds::Target> LinkIds::find(const std::string& id) const {
	Table::const_iterator i=mTable.find(_scrubKey(id));
	if (i!=mTable.end()) return i->second;
	else return none;
}